

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.h
# Opt level: O3

void __thiscall UnifiedRegex::CharBitvec::SetRange(CharBitvec *this,uint l,uint h)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  sbyte sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  
  if (0xff < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x5b,"(l < Size)","l < Size");
    if (!bVar2) goto LAB_00e5e4b9;
    *puVar4 = 0;
  }
  if (0xff < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                       ,0x5c,"(h < Size)","h < Size");
    if (!bVar2) {
LAB_00e5e4b9:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if ((h | l) < 0x100) {
    if (l == h) {
      this->vec[l >> 5] = this->vec[l >> 5] | 1 << ((byte)l & 0x1f);
    }
    else if (l < h) {
      uVar6 = l >> 5;
      uVar7 = h >> 5;
      uVar3 = l & 0x1f;
      uVar8 = h & 0x1f;
      sVar5 = (sbyte)uVar3;
      if (uVar6 == uVar7) {
        iVar9 = (uVar8 - uVar3) + 1;
        uVar3 = 0xffffffff;
        if (iVar9 != 0x20) {
          uVar3 = ~(-1 << ((byte)iVar9 & 0x1f)) << sVar5 | this->vec[uVar6];
        }
        this->vec[uVar6] = uVar3;
      }
      else {
        if (uVar3 == 0) {
          uVar3 = 0xffffffff;
        }
        else {
          uVar3 = ~(-1 << (-sVar5 & 0x1fU)) << sVar5 | this->vec[uVar6];
        }
        this->vec[uVar6] = uVar3;
        if (uVar6 + 1 < uVar7) {
          memset((void *)((long)this->vec + (ulong)(l >> 3 & 0x1c) + 4),0xff,
                 (ulong)((uVar7 - uVar6) - 2) * 4 + 4);
        }
        uVar3 = 0xffffffff;
        if (uVar8 != 0x1f) {
          uVar3 = ~(-2 << (sbyte)uVar8) | this->vec[uVar7];
        }
        this->vec[uVar7] = uVar3;
      }
    }
  }
  return;
}

Assistant:

inline void SetRange(uint l, uint h)
        {
            Assert(l < Size);
            Assert(h < Size);
            __assume(l < Size);
            __assume(h < Size);
            if (l < Size && h < Size)
            {
                if (l == h)
                {
                    vec[l / wordSize] |= 1U << (l % wordSize);
                }
                else if (l < h)
                {
                    int lw = l / wordSize;
                    int hw = h / wordSize;
                    int lo = l % wordSize;
                    int hio = h % wordSize;
                    if (lw == hw)
                    {
                        setrng(vec[lw], lo, hio);
                    }
                    else
                    {
                        setrng(vec[lw], lo, wordSize - 1);
                        for (int w = lw + 1; w < hw; w++)
                        {
                            vec[w] = ones;
                        }
                        setrng(vec[hw], 0, hio);
                    }
                }
            }
        }